

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

int Cec_ManSeqSemiformal(Gia_Man_t *pAig,Cec_ParSmf_t *pPars)

{
  int iVar1;
  Abc_Cex_t *pInit;
  Gia_Man_t *pGVar2;
  void **ppvVar3;
  void **ppvVar4;
  Vec_Ptr_t *vInfo;
  Vec_Str_t *__ptr;
  Gia_Man_t *pInit_00;
  int iVar5;
  ulong uVar6;
  void **ppvVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  int nPats;
  int nFramesReal;
  Cec_ParSat_t ParsSat;
  uint local_78;
  uint local_74;
  int local_70;
  int local_6c;
  Abc_Cex_t *local_68;
  Cec_ParSmf_t *local_60;
  Cec_ParSat_t local_54;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar9 = "Cec_ManSeqSemiformal(): Equivalence classes are not available.\n";
  }
  else {
    if (pAig->nRegs != 0) {
      Gia_ManRandom(1);
      iVar1 = 0;
      pInit = Abc_CexAlloc(pAig->nRegs,0,0);
      pInit->iPo = -1;
      pInit->iFrame = -1;
      Cec_ManSatSetDefaultParams(&local_54);
      local_54.nBTLimit = pPars->nBTLimit;
      local_54.fVerbose = pPars->fVerbose;
      if (local_54.fVerbose != 0) {
        Abc_Print(1,"Starting: ");
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Gia_ManCleanMark0(pAig);
      if (0 < pPars->nRounds) {
        iVar10 = 0;
        iVar5 = 0;
        local_68 = pInit;
        local_60 = pPars;
        do {
          local_70 = iVar5;
          iVar1 = Cec_ManCheckNonTrivialCands(pAig);
          if (iVar1 == 0) {
            pcVar9 = 
            "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n"
            ;
LAB_0065f07f:
            iVar1 = 0;
LAB_0065f091:
            Abc_Print(1,pcVar9);
            break;
          }
          pGVar2 = Gia_ManSpecReduceInitFrames
                             (pAig,pInit,pPars->nFrames,(int *)&local_74,pPars->fDualOut,
                              pPars->nMinOutputs);
          if (pGVar2 == (Gia_Man_t *)0x0) {
            pcVar9 = "Quitting refinement because miter could not be unrolled.\n";
            goto LAB_0065f07f;
          }
          if (pGVar2->nRegs != 0) {
LAB_0065f0e4:
            __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                          ,0x17d,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
          }
          iVar1 = pAig->nRegs;
          iVar5 = pAig->vCis->nSize - iVar1;
          if (pGVar2->vCis->nSize != iVar5 * local_74) goto LAB_0065f0e4;
          local_6c = iVar10;
          if (pPars->fVerbose != 0) {
            Abc_Print(1,"Unrolled for %d frames.\n",(ulong)local_74);
            iVar1 = pAig->nRegs;
            iVar5 = pAig->vCis->nSize - iVar1;
          }
          uVar8 = (local_74 + 0x10) * iVar5 + iVar1;
          iVar1 = pPars->nWords;
          ppvVar3 = (void **)malloc(((long)iVar1 * 4 + 8) * (long)(int)uVar8);
          if (0 < (int)uVar8) {
            ppvVar4 = ppvVar3 + (int)uVar8;
            uVar6 = (ulong)uVar8;
            ppvVar7 = ppvVar3;
            do {
              *ppvVar7 = ppvVar4;
              ppvVar7 = ppvVar7 + 1;
              ppvVar4 = (void **)((long)ppvVar4 + (long)iVar1 * 4);
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          vInfo = (Vec_Ptr_t *)malloc(0x10);
          pInit = local_68;
          vInfo->nSize = uVar8;
          vInfo->nCap = uVar8;
          vInfo->pArray = ppvVar3;
          Cec_ManSeqDeriveInfoInitRandom(vInfo,pAig,local_68);
          __ptr = Cec_ManSatSolveSeq(vInfo,pGVar2,&local_54,pAig->nRegs,(int *)&local_78);
          if (__ptr->pArray != (char *)0x0) {
            free(__ptr->pArray);
          }
          free(__ptr);
          Gia_ManStop(pGVar2);
          pPars = local_60;
          iVar1 = Cec_ManSeqResimulateInfo(pAig,vInfo,pInit,local_60->fCheckMiter);
          if (vInfo->pArray != (void **)0x0) {
            free(vInfo->pArray);
          }
          free(vInfo);
          if (pInit->iPo < 0) {
            __assert_fail("pState->iPo >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                          ,0x18b,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
          }
          pInit->iPo = -1;
          if (pPars->fVerbose != 0) {
            Abc_Print(1,"BMC = %3d ",(ulong)local_78);
            Gia_ManEquivPrintClasses(pAig,0,0.0);
          }
          Gia_AigerWrite(pAig,"gore.aig",0,0,0);
          pGVar2 = Gia_ManSpecReduce(pAig,0,0,1,0,0);
          if (pGVar2 != (Gia_Man_t *)0x0) {
            pInit_00 = Gia_ManSeqStructSweep(pGVar2,1,1,0);
            Gia_ManStop(pGVar2);
            Gia_AigerWrite(pInit_00,"gsrm.aig",0,0,0);
            Gia_ManStop(pInit_00);
          }
          if (iVar1 != 0) {
            iVar1 = 1;
            pcVar9 = 
            "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n";
            goto LAB_0065f091;
          }
          iVar1 = 0;
          iVar5 = 0;
          if (((int)local_78 < 1) && (iVar5 = local_70 + 1, iVar5 == pPars->nNonRefines)) {
            iVar1 = 0;
            break;
          }
          iVar10 = local_6c + 1;
        } while (iVar10 < pPars->nRounds);
      }
      free(pInit);
      if (pPars->fCheckMiter == 0) {
        return iVar1;
      }
      uVar8 = Cec_ManCountNonConstOutputs(pAig);
      if (uVar8 == 0) {
        return iVar1;
      }
      Abc_Print(1,"The number of POs that are not const-0 candidates = %d.\n",(ulong)uVar8);
      return iVar1;
    }
    pcVar9 = "Cec_ManSeqSemiformal(): Not a sequential AIG.\n";
  }
  Abc_Print(1,pcVar9);
  return -1;
}

Assistant:

int Cec_ManSeqSemiformal( Gia_Man_t * pAig, Cec_ParSmf_t * pPars )
{ 
    int nAddFrames = 16; // additional timeframes to simulate
    int nCountNoRef = 0;
    int nFramesReal;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Ptr_t * vSimInfo; 
    Vec_Str_t * vStatus;
    Abc_Cex_t * pState;
    Gia_Man_t * pSrm, * pReduce, * pAux;
    int r, nPats, RetValue = 0;
    if ( pAig->pReprs == NULL )
    { 
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Not a sequential AIG.\n" );
        return -1;
    }
    Gia_ManRandom( 1 );
    // prepare starting pattern
    pState = Abc_CexAlloc( Gia_ManRegNum(pAig), 0, 0 );
    pState->iFrame = -1;
    pState->iPo = -1;
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pParsSat->fVerbose )
    {
        Abc_Print( 1, "Starting: " );
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    }
    // perform the given number of BMC rounds
    Gia_ManCleanMark0( pAig );
    for ( r = 0; r < pPars->nRounds; r++ )
    {
        if ( !Cec_ManCheckNonTrivialCands(pAig) )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n" );
            break;
        }
//        Abc_CexPrint( pState );
        // derive speculatively reduced model
//        pSrm = Gia_ManSpecReduceInit( pAig, pState, pPars->nFrames, pPars->fDualOut );
        pSrm = Gia_ManSpecReduceInitFrames( pAig, pState, pPars->nFrames, &nFramesReal, pPars->fDualOut, pPars->nMinOutputs );
        if ( pSrm == NULL )
        {
            Abc_Print( 1, "Quitting refinement because miter could not be unrolled.\n" );
            break;
        }
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal) );
        if ( pPars->fVerbose )
            Abc_Print( 1, "Unrolled for %d frames.\n", nFramesReal );
        // allocate room for simulation info
        vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
            Gia_ManPiNum(pAig) * (nFramesReal + nAddFrames), pPars->nWords );
        Cec_ManSeqDeriveInfoInitRandom( vSimInfo, pAig, pState );
        // fill in simulation info with counter-examples
        vStatus = Cec_ManSatSolveSeq( vSimInfo, pSrm, pParsSat, Gia_ManRegNum(pAig), &nPats );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        // resimulate and refine the classes
        RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, pState, pPars->fCheckMiter );
        Vec_PtrFree( vSimInfo );
        assert( pState->iPo >= 0 ); // hit counter
        pState->iPo = -1;
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "BMC = %3d ", nPats );
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        }

        // write equivalence classes
        Gia_AigerWrite( pAig, "gore.aig", 0, 0, 0 );
        // reduce the model
        pReduce = Gia_ManSpecReduce( pAig, 0, 0, 1, 0, 0 );
        if ( pReduce )
        {
            pReduce = Gia_ManSeqStructSweep( pAux = pReduce, 1, 1, 0 );
            Gia_ManStop( pAux );
            Gia_AigerWrite( pReduce, "gsrm.aig", 0, 0, 0 );
//            Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", "gsrm.aig" );
//          Gia_ManPrintStatsShort( pReduce );
            Gia_ManStop( pReduce );
        }

        if ( RetValue )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n" );
            break;
        }
        // decide when to stop
        if ( nPats > 0 )
            nCountNoRef = 0;
        else if ( ++nCountNoRef == pPars->nNonRefines )
            break;
    }
    ABC_FREE( pState );
    if ( pPars->fCheckMiter )
    {
        int nNonConsts = Cec_ManCountNonConstOutputs( pAig );
        if ( nNonConsts )
            Abc_Print( 1, "The number of POs that are not const-0 candidates = %d.\n", nNonConsts );
    }
    return RetValue;
}